

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxh3.h
# Opt level: O2

XXH64_hash_t XXH3_hashLong_64b(void *data,size_t len,XXH64_hash_t seed)

{
  U32 UVar1;
  undefined8 uVar2;
  int i;
  ulong uVar3;
  XXH64_hash_t XVar4;
  U32 key [48];
  XXH64_hash_t local_180 [7];
  undefined8 local_148;
  U32 local_140;
  undefined8 uStack_13c;
  int aiStack_134 [71];
  
  local_180[1] = 0x9e3779b185ebca87;
  local_180[2] = 0xc2b2ae3d27d4eb4f;
  local_180[3] = 0x165667b19e3779f9;
  local_180[4] = 0x85ebca77c2b2ae63;
  local_180[5] = 0x27d4eb2f165667c5;
  local_180[6] = -seed;
  local_148 = 0;
  for (uVar3 = 0; uVar3 < 0x30; uVar3 = uVar3 + 4) {
    UVar1 = kKey[uVar3 + 3];
    uVar2 = *(undefined8 *)(kKey + uVar3 + 1);
    (&local_140)[uVar3] = kKey[uVar3] + (int)seed;
    *(undefined8 *)(aiStack_134 + (uVar3 - 2)) = uVar2;
    aiStack_134[uVar3] = UVar1 - (int)seed;
  }
  local_180[0] = seed;
  XXH3_hashLong(local_180,data,len);
  XVar4 = XXH3_mergeAccs(local_180,&local_140,len * -0x61c8864e7a143579);
  return XVar4;
}

Assistant:

XXH_NO_INLINE XXH64_hash_t    /* It's important for performance that XXH3_hashLong is not inlined. Not sure why (uop cache maybe ?), but difference is large and easily measurable */
XXH3_hashLong_64b(const void* data, size_t len, XXH64_hash_t seed)
{
    ALIGN(64) U64 acc[ACC_NB] = { seed, PRIME64_1, PRIME64_2, PRIME64_3, PRIME64_4, PRIME64_5, (U64)0 - seed, 0 };
    ALIGN(64) U32 key[KEYSET_DEFAULT_SIZE];

    XXH3_initKeySeed(key, seed);

    XXH3_hashLong(acc, data, len);

    /* converge into final hash */
    assert(sizeof(acc) == 64);
    return XXH3_mergeAccs(acc, key, (U64)len * PRIME64_1);
}